

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall vmgram_alt_info::vmgram_alt_info(vmgram_alt_info *this,size_t ntoks)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  vmgram_tok_info *pvVar4;
  ulong in_RSI;
  undefined4 *in_RDI;
  ulong uVar5;
  vmgram_tok_info *local_50;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
  uVar5 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = in_RSI;
  pvVar4 = (vmgram_tok_info *)(puVar3 + 1);
  if (in_RSI != 0) {
    local_50 = pvVar4;
    do {
      vmgram_tok_info::vmgram_tok_info(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pvVar4 + in_RSI);
  }
  *(vmgram_tok_info **)(in_RDI + 4) = pvVar4;
  *(ulong *)(in_RDI + 6) = in_RSI;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

vmgram_alt_info::vmgram_alt_info(size_t ntoks)
{
    toks = new vmgram_tok_info[ntoks];
    tok_cnt = ntoks;
    score = 0;
    badness = 0;
    del = FALSE;
}